

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

tss_data_node * boost::detail::find_tss_data(void *key)

{
  bool bVar1;
  pointer ppVar2;
  iterator current_node;
  thread_data_base *current_thread_data;
  _Self in_stack_ffffffffffffffd8;
  _Self local_20;
  thread_data_base *local_18;
  
  local_18 = get_current_thread_data();
  if (local_18 != (thread_data_base *)0x0) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
         ::find(in_stack_ffffffffffffffd8._M_node,(key_type *)0x2a4751);
    std::
    map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
    ::end((map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
           *)in_stack_ffffffffffffffd8._M_node);
    bVar1 = std::operator!=(&local_20,(_Self *)&stack0xffffffffffffffd8);
    if (bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>::
               operator->((_Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>
                           *)0x2a4788);
      return &ppVar2->second;
    }
  }
  return (tss_data_node *)0x0;
}

Assistant:

tss_data_node* find_tss_data(void const* key)
        {
            detail::thread_data_base* const current_thread_data(get_current_thread_data());
            if(current_thread_data)
            {
                std::map<void const*,tss_data_node>::iterator current_node=
                    current_thread_data->tss_data.find(key);
                if(current_node!=current_thread_data->tss_data.end())
                {
                    return &current_node->second;
                }
            }
            return 0;
        }